

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

char * CBS_asn1_oid_to_text(CBS *cbs)

{
  uint64_t uVar1;
  int iVar2;
  uint64_t v_00;
  uint64_t v;
  CBS copy;
  uint8_t *txt;
  CBB cbb;
  size_t txt_len;
  
  copy.data = cbs->data;
  copy.len = cbs->len;
  iVar2 = CBB_init(&cbb,0x20);
  if ((iVar2 != 0) && (iVar2 = parse_base128_integer(&copy,&v), uVar1 = v, iVar2 != 0)) {
    if (v < 0x50) {
      iVar2 = add_decimal(&cbb,(ulong)(0x27 < v));
      if ((iVar2 == 0) || (iVar2 = CBB_add_u8(&cbb,'.'), iVar2 == 0)) goto LAB_001a7a49;
      v_00 = uVar1 - 0x28;
      if (uVar1 < 0x28) {
        v_00 = uVar1;
      }
    }
    else {
      iVar2 = CBB_add_bytes(&cbb,(uint8_t *)"2.",2);
      if (iVar2 == 0) goto LAB_001a7a49;
      v_00 = uVar1 - 0x50;
    }
    iVar2 = add_decimal(&cbb,v_00);
    if (iVar2 != 0) {
      while (copy.len != 0) {
        iVar2 = parse_base128_integer(&copy,&v);
        if (((iVar2 == 0) || (iVar2 = CBB_add_u8(&cbb,'.'), iVar2 == 0)) ||
           (iVar2 = add_decimal(&cbb,v), iVar2 == 0)) goto LAB_001a7a49;
      }
      iVar2 = CBB_add_u8(&cbb,'\0');
      if ((iVar2 != 0) && (iVar2 = CBB_finish(&cbb,&txt,&txt_len), iVar2 != 0)) {
        return (char *)txt;
      }
    }
  }
LAB_001a7a49:
  CBB_cleanup(&cbb);
  return (char *)0x0;
}

Assistant:

char *CBS_asn1_oid_to_text(const CBS *cbs) {
  CBS copy = *cbs;
  CBB cbb;
  if (!CBB_init(&cbb, 32)) {
    goto err;
  }

  // The first component is 40 * value1 + value2, where value1 is 0, 1, or 2.
  uint64_t v;
  if (!parse_base128_integer(&copy, &v)) {
    goto err;
  }

  if (v >= 80) {
    if (!CBB_add_bytes(&cbb, (const uint8_t *)"2.", 2) ||
        !add_decimal(&cbb, v - 80)) {
      goto err;
    }
  } else if (!add_decimal(&cbb, v / 40) || !CBB_add_u8(&cbb, '.') ||
             !add_decimal(&cbb, v % 40)) {
    goto err;
  }

  while (CBS_len(&copy) != 0) {
    if (!parse_base128_integer(&copy, &v) || !CBB_add_u8(&cbb, '.') ||
        !add_decimal(&cbb, v)) {
      goto err;
    }
  }

  uint8_t *txt;
  size_t txt_len;
  if (!CBB_add_u8(&cbb, '\0') || !CBB_finish(&cbb, &txt, &txt_len)) {
    goto err;
  }

  return (char *)txt;

err:
  CBB_cleanup(&cbb);
  return NULL;
}